

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json_test.cpp
# Opt level: O3

void __thiscall
PersistentStorageJsonTestSuite_ReadEmptyFile_Test::TestBody
          (PersistentStorageJsonTestSuite_ReadEmptyFile_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  Status SVar3;
  char *in_R9;
  PersistentStorageJson psj;
  ofstream testTmp;
  AssertHelper local_290;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_288;
  internal local_280 [8];
  undefined8 *local_278;
  string local_270;
  PersistentStorageJson local_250;
  long local_210;
  filebuf local_208 [240];
  ios_base local_118 [264];
  
  std::ofstream::ofstream(&local_210,"./tmp/test.tmp",_S_out);
  std::ofstream::close();
  paVar1 = &local_270.field_2;
  local_270._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"./tmp/test.tmp","");
  ot::commissioner::persistent_storage::PersistentStorageJson::PersistentStorageJson
            (&local_250,&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != paVar1) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  SVar3 = ot::commissioner::persistent_storage::PersistentStorageJson::Open(&local_250);
  local_280[0] = (internal)(SVar3 == kSuccess);
  local_278 = (undefined8 *)0x0;
  if (!(bool)local_280[0]) {
    testing::Message::Message((Message *)&local_288);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_270,local_280,
               (AssertionResult *)"psj.Open() == PersistentStorage::Status::kSuccess","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x48,local_270._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar1) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    if (local_288._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_288._M_head_impl + 8))();
    }
    puVar2 = local_278;
    if (local_278 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_278 != local_278 + 2) {
        operator_delete((undefined8 *)*local_278);
      }
      operator_delete(puVar2);
    }
  }
  SVar3 = ot::commissioner::persistent_storage::PersistentStorageJson::Close(&local_250);
  local_280[0] = (internal)(SVar3 == kSuccess);
  local_278 = (undefined8 *)0x0;
  if (!(bool)local_280[0]) {
    testing::Message::Message((Message *)&local_288);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_270,local_280,
               (AssertionResult *)"psj.Close() == PersistentStorage::Status::kSuccess","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json_test.cpp"
               ,0x49,local_270._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_290,(Message *)&local_288);
    testing::internal::AssertHelper::~AssertHelper(&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != paVar1) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    if (local_288._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_288._M_head_impl + 8))();
    }
    puVar2 = local_278;
    if (local_278 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_278 != local_278 + 2) {
        operator_delete((undefined8 *)*local_278);
      }
      operator_delete(puVar2);
    }
  }
  ot::commissioner::persistent_storage::PersistentStorageJson::~PersistentStorageJson(&local_250);
  local_210 = _VTT;
  *(undefined8 *)(local_208 + *(long *)(_VTT + -0x18) + -8) = _recvfrom;
  std::filebuf::~filebuf(local_208);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

TEST(PersistentStorageJsonTestSuite, ReadEmptyFile)
{
    std::ofstream testTmp("./tmp/test.tmp");
    testTmp.close();

    PersistentStorageJson psj("./tmp/test.tmp");

    EXPECT_TRUE(psj.Open() == PersistentStorage::Status::kSuccess);
    EXPECT_TRUE(psj.Close() == PersistentStorage::Status::kSuccess);
}